

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.c
# Opt level: O0

int nni_msg_realloc(nni_msg *m,size_t sz)

{
  int iVar1;
  int rv;
  size_t sz_local;
  nni_msg *m_local;
  
  if ((m->m_body).ch_len < sz) {
    iVar1 = nni_chunk_append(&m->m_body,(void *)0x0,sz - (m->m_body).ch_len);
    if (iVar1 != 0) {
      return iVar1;
    }
  }
  else {
    nni_chunk_chop(&m->m_body,(m->m_body).ch_len - sz);
  }
  return 0;
}

Assistant:

int
nni_msg_realloc(nni_msg *m, size_t sz)
{
	if (m->m_body.ch_len < sz) {
		int rv =
		    nni_chunk_append(&m->m_body, NULL, sz - m->m_body.ch_len);
		if (rv != 0) {
			return (rv);
		}
	} else {
		// "Shrinking", just mark bytes at end usable again.
		nni_chunk_chop(&m->m_body, m->m_body.ch_len - sz);
	}
	return (0);
}